

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O0

void __thiscall
Address_ElementsP2wpkhAddressTest_Test::TestBody(Address_ElementsP2wpkhAddressTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_928;
  Message local_920;
  Script local_918;
  string local_8e0;
  undefined1 local_8c0 [8];
  AssertionResult gtest_ar_13;
  Message local_8a8;
  Pubkey local_8a0;
  string local_888;
  undefined1 local_868 [8];
  AssertionResult gtest_ar_12;
  Message local_850;
  ByteData local_848;
  string local_830;
  undefined1 local_810 [8];
  AssertionResult gtest_ar_11;
  Message local_7f8;
  WitnessVersion local_7f0 [2];
  undefined1 local_7e8 [8];
  AssertionResult gtest_ar_10;
  Message local_7d0;
  AddressType local_7c8 [2];
  undefined1 local_7c0 [8];
  AssertionResult gtest_ar_9;
  Message local_7a8;
  NetType local_7a0 [2];
  undefined1 local_798 [8];
  AssertionResult gtest_ar_8;
  Message local_780;
  string local_778;
  undefined1 local_758 [8];
  AssertionResult gtest_ar_7;
  Message local_740;
  Address local_738;
  AssertHelper local_5c0;
  Message local_5b8;
  Script local_5b0;
  string local_578;
  undefined1 local_558 [8];
  AssertionResult gtest_ar_6;
  Message local_540;
  Pubkey local_538;
  string local_520;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_5;
  Message local_4e8;
  ByteData local_4e0;
  string local_4c8;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar_4;
  Message local_490;
  WitnessVersion local_488 [2];
  undefined1 local_480 [8];
  AssertionResult gtest_ar_3;
  Message local_468;
  AddressType local_460 [2];
  undefined1 local_458 [8];
  AssertionResult gtest_ar_2;
  Message local_440;
  NetType local_438 [2];
  undefined1 local_430 [8];
  AssertionResult gtest_ar_1;
  Message local_418;
  string local_410;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar;
  Message local_3d8 [2];
  string local_3c8;
  Address local_3a8;
  undefined1 local_230 [8];
  Address address;
  string local_b0;
  undefined1 local_90 [8];
  AddressFormatData net_param;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  Pubkey pubkey;
  Address_ElementsP2wpkhAddressTest_Test *this_local;
  
  pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",&local_49);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b0,
             "{\"nettype\":\"custom\",\"p2pkh\":\"eb\",\"p2sh\":\"4b\",\"bech32\":\"ert\"}",
             (allocator *)
             ((long)&address.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
            );
  cfd::core::AddressFormatData::ConvertFromJson((AddressFormatData *)local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&address.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
            );
  cfd::core::Address::Address((Address *)local_230);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::AddressFormatData::GetBech32Hrp_abi_cxx11_
                (&local_3c8,(AddressFormatData *)local_90);
      cfd::core::Address::Address
                (&local_3a8,kCfdConnectionError,kVersion0,(Pubkey *)local_28,&local_3c8);
      cfd::core::Address::operator=((Address *)local_230,&local_3a8);
      cfd::core::Address::~Address(&local_3a8);
      std::__cxx11::string::~string((string *)&local_3c8);
    }
  }
  else {
    testing::Message::Message(local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1db,
               "Expected: (address = Address(NetType::kCustomChain, WitnessVersion::kVersion0, pubkey, net_param.GetBech32Hrp())) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_3d8);
  }
  cfd::core::Address::GetAddress_abi_cxx11_(&local_410,(Address *)local_230);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3f0,"\"ert1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5udafvh6\"",
             "address.GetAddress().c_str()","ert1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5udafvh6",pcVar2);
  std::__cxx11::string::~string((string *)&local_410);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1dd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  local_438[1] = 5;
  local_438[0] = cfd::core::Address::GetNetType((Address *)local_230);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_430,"NetType::kCustomChain","address.GetNetType()",
             local_438 + 1,local_438);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
  if (!bVar1) {
    testing::Message::Message(&local_440);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_430);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1de,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_440);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
  local_460[1] = 4;
  local_460[0] = cfd::core::Address::GetAddressType((Address *)local_230);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_458,"AddressType::kP2wpkhAddress","address.GetAddressType()",
             local_460 + 1,local_460);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar1) {
    testing::Message::Message(&local_468);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1df,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_468);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  local_488[1] = 0;
  local_488[0] = cfd::core::Address::GetWitnessVersion((Address *)local_230);
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((EqHelper<false> *)local_480,"WitnessVersion::kVersion0","address.GetWitnessVersion()",
             local_488 + 1,local_488);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
  if (!bVar1) {
    testing::Message::Message(&local_490);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_480);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1e0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_490);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_490);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
  cfd::core::Address::GetHash(&local_4e0,(Address *)local_230);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_4c8,&local_4e0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_4a8,"\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             "address.GetHash().GetHex().c_str()","925d4028880bd0c9d68fbc7fc7dfee976698629c",pcVar2)
  ;
  std::__cxx11::string::~string((string *)&local_4c8);
  cfd::core::ByteData::~ByteData(&local_4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar1) {
    testing::Message::Message(&local_4e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1e2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  cfd::core::Address::GetPubkey(&local_538,(Address *)local_230);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_520,&local_538);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_500,
             "\"027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af\"",
             "address.GetPubkey().GetHex().c_str()",
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",pcVar2);
  std::__cxx11::string::~string((string *)&local_520);
  cfd::core::Pubkey::~Pubkey(&local_538);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_540);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1e4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_540);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_540);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  cfd::core::Address::GetScript(&local_5b0,(Address *)local_230);
  cfd::core::Script::GetHex_abi_cxx11_(&local_578,&local_5b0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_558,"\"\"","address.GetScript().GetHex().c_str()","",pcVar2);
  std::__cxx11::string::~string((string *)&local_578);
  cfd::core::Script::~Script(&local_5b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_558);
    testing::internal::AssertHelper::AssertHelper
              (&local_5c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1e5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5c0,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper(&local_5c0);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Address::Address
                (&local_738,kCfdConnectionError,kVersion0,(Pubkey *)local_28,
                 (AddressFormatData *)local_90);
      cfd::core::Address::operator=((Address *)local_230,&local_738);
      cfd::core::Address::~Address(&local_738);
    }
  }
  else {
    testing::Message::Message(&local_740);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1e8,
               "Expected: (address = Address(NetType::kCustomChain, WitnessVersion::kVersion0, pubkey, net_param)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_740);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_740);
  }
  cfd::core::Address::GetAddress_abi_cxx11_(&local_778,(Address *)local_230);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_758,"\"ert1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5udafvh6\"",
             "address.GetAddress().c_str()","ert1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5udafvh6",pcVar2);
  std::__cxx11::string::~string((string *)&local_778);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_758);
  if (!bVar1) {
    testing::Message::Message(&local_780);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_758);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1ea,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_780);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_780);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_758);
  local_7a0[1] = 5;
  local_7a0[0] = cfd::core::Address::GetNetType((Address *)local_230);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_798,"NetType::kCustomChain","address.GetNetType()",
             local_7a0 + 1,local_7a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
  if (!bVar1) {
    testing::Message::Message(&local_7a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_798);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1eb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_7a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_7a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
  local_7c8[1] = 4;
  local_7c8[0] = cfd::core::Address::GetAddressType((Address *)local_230);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_7c0,"AddressType::kP2wpkhAddress","address.GetAddressType()",
             local_7c8 + 1,local_7c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c0);
  if (!bVar1) {
    testing::Message::Message(&local_7d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1ec,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_7d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_7d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c0);
  local_7f0[1] = 0;
  local_7f0[0] = cfd::core::Address::GetWitnessVersion((Address *)local_230);
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((EqHelper<false> *)local_7e8,"WitnessVersion::kVersion0","address.GetWitnessVersion()",
             local_7f0 + 1,local_7f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e8);
  if (!bVar1) {
    testing::Message::Message(&local_7f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1ed,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_7f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e8);
  cfd::core::Address::GetHash(&local_848,(Address *)local_230);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_830,&local_848);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_810,"\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             "address.GetHash().GetHex().c_str()","925d4028880bd0c9d68fbc7fc7dfee976698629c",pcVar2)
  ;
  std::__cxx11::string::~string((string *)&local_830);
  cfd::core::ByteData::~ByteData(&local_848);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_810);
  if (!bVar1) {
    testing::Message::Message(&local_850);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_810);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1ef,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_850);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_850);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_810);
  cfd::core::Address::GetPubkey(&local_8a0,(Address *)local_230);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_888,&local_8a0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_868,
             "\"027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af\"",
             "address.GetPubkey().GetHex().c_str()",
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",pcVar2);
  std::__cxx11::string::~string((string *)&local_888);
  cfd::core::Pubkey::~Pubkey(&local_8a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_868);
  if (!bVar1) {
    testing::Message::Message(&local_8a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_868);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1f1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_8a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_8a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_868);
  cfd::core::Address::GetScript(&local_918,(Address *)local_230);
  cfd::core::Script::GetHex_abi_cxx11_(&local_8e0,&local_918);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_8c0,"\"\"","address.GetScript().GetHex().c_str()","",pcVar2);
  std::__cxx11::string::~string((string *)&local_8e0);
  cfd::core::Script::~Script(&local_918);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c0);
  if (!bVar1) {
    testing::Message::Message(&local_920);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_928,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1f2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_928,&local_920);
    testing::internal::AssertHelper::~AssertHelper(&local_928);
    testing::Message::~Message(&local_920);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c0);
  cfd::core::Address::~Address((Address *)local_230);
  cfd::core::AddressFormatData::~AddressFormatData((AddressFormatData *)local_90);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_28);
  return;
}

Assistant:

TEST(Address, ElementsP2wpkhAddressTest) {
  const Pubkey pubkey = Pubkey(
      "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  AddressFormatData net_param = AddressFormatData::ConvertFromJson(
      "{\"nettype\":\"custom\",\"p2pkh\":\"eb\",\"p2sh\":\"4b\",\"bech32\":\"ert\"}");
  Address address;

  EXPECT_NO_THROW((address = Address(NetType::kCustomChain,
                   WitnessVersion::kVersion0, pubkey, net_param.GetBech32Hrp())));
  EXPECT_STREQ("ert1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5udafvh6",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kCustomChain, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wpkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",
               address.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("", address.GetScript().GetHex().c_str());

  EXPECT_NO_THROW((address = Address(NetType::kCustomChain,
                   WitnessVersion::kVersion0, pubkey, net_param)));
  EXPECT_STREQ("ert1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5udafvh6",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kCustomChain, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wpkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",
               address.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("", address.GetScript().GetHex().c_str());
}